

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

point3f tinyusdz::transform(matrix4d *m,point3f *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  point3f pVar4;
  point3f pVar5;
  
  dVar1 = m->m[3][0];
  dVar2 = m->m[3][1];
  dVar3 = m->m[3][2];
  pVar4 = value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::point3f,double,float,3ul>(m,p);
  pVar5.z = pVar4.z + (float)dVar3;
  pVar5.y = pVar4.y + (float)dVar2;
  pVar5.x = (float)dVar1 + pVar4.x;
  return pVar5;
}

Assistant:

value::point3f transform(const value::matrix4d &m, const value::point3f &p) {
  value::point3f tx{float(m.m[3][0]), float(m.m[3][1]), float(m.m[3][2])};
  return value::MultV<value::matrix4d, value::point3f, double, float, 3>(m, p) + tx;
}